

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  Message::Message((Message *)&local_30);
  __s = *value;
  poVar3 = (ostream *)(local_30.ptr_ + 0x10);
  if (__s == (char *)0x0) {
    sVar2 = 6;
    __s = "(null)";
  }
  else {
    sVar2 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  AppendMessage(this,(Message *)&local_30);
  if (((local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = internal::IsTrue(true), bVar1)) &&
     (local_30.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }